

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2edge_crossings.cc
# Opt level: O0

bool S2::VertexCrossing(S2Point *a,S2Point *b,S2Point *c,S2Point *d)

{
  bool bVar1;
  ostream *poVar2;
  bool local_ae;
  bool local_ad;
  S2LogMessage local_a0;
  S2Point local_90;
  S2Point local_78;
  S2Point local_60;
  S2Point local_48;
  D *local_30;
  S2Point *d_local;
  S2Point *c_local;
  S2Point *b_local;
  S2Point *a_local;
  
  local_30 = d;
  d_local = c;
  c_local = b;
  b_local = a;
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                    ((BasicVector<Vector3,_double,_3UL> *)a,b);
  if ((bVar1) ||
     (bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)d_local,local_30), bVar1)) {
    return false;
  }
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                    ((BasicVector<Vector3,_double,_3UL> *)b_local,d_local);
  if (bVar1) {
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)c_local,local_30);
    local_ad = true;
    if (!bVar1) {
      Ortho(&local_48,b_local);
      local_ad = s2pred::OrderedCCW(&local_48,local_30,c_local,b_local);
    }
    return local_ad;
  }
  bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                    ((BasicVector<Vector3,_double,_3UL> *)c_local,local_30);
  if (!bVar1) {
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)b_local,local_30);
    if (bVar1) {
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)c_local,d_local);
      local_ae = true;
      if (!bVar1) {
        Ortho(&local_78,b_local);
        local_ae = s2pred::OrderedCCW(&local_78,d_local,c_local,b_local);
      }
      return local_ae;
    }
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      ((BasicVector<Vector3,_double,_3UL> *)c_local,d_local);
    if (bVar1) {
      Ortho(&local_90,c_local);
      bVar1 = s2pred::OrderedCCW(&local_90,local_30,b_local,c_local);
      return bVar1;
    }
    S2FatalLogMessage::S2FatalLogMessage
              ((S2FatalLogMessage *)&local_a0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2edge_crossings.cc"
               ,0x61,kFatal,(ostream *)&std::cerr);
    poVar2 = S2LogMessage::stream(&local_a0);
    std::operator<<(poVar2,"VertexCrossing called with 4 distinct vertices");
    S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_a0);
  }
  Ortho(&local_60,c_local);
  bVar1 = s2pred::OrderedCCW(&local_60,d_local,b_local,c_local);
  return bVar1;
}

Assistant:

bool VertexCrossing(const S2Point& a, const S2Point& b,
                    const S2Point& c, const S2Point& d) {
  // If A == B or C == D there is no intersection.  We need to check this
  // case first in case 3 or more input points are identical.
  if (a == b || c == d) return false;

  // If any other pair of vertices is equal, there is a crossing if and only
  // if OrderedCCW() indicates that the edge AB is further CCW around the
  // shared vertex O (either A or B) than the edge CD, starting from an
  // arbitrary fixed reference point.
  //
  // Optimization: if AB=CD or AB=DC, we can avoid most of the calculations.
  if (a == c) return (b == d) || s2pred::OrderedCCW(S2::Ortho(a), d, b, a);
  if (b == d) return s2pred::OrderedCCW(S2::Ortho(b), c, a, b);

  if (a == d) return (b == c) || s2pred::OrderedCCW(S2::Ortho(a), c, b, a);
  if (b == c) return s2pred::OrderedCCW(S2::Ortho(b), d, a, b);

  S2_LOG(DFATAL) << "VertexCrossing called with 4 distinct vertices";
  return false;
}